

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O1

void __thiscall NaTextStreamFile::SetValue(NaTextStreamFile *this,NaReal fVal,int iVar)

{
  int iVar1;
  NaReal *pNVar2;
  NaReal *pNVar3;
  undefined4 *puVar4;
  ulong uVar5;
  NaReal NVar6;
  
  if (this->iCase == -1) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 1;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  iVar1 = this->nVar;
  if ((long)iVar1 == 0) {
    this->nVar = iVar + 1U;
    uVar5 = 0xffffffffffffffff;
    if (-2 < iVar) {
      uVar5 = (long)iVar * 8 + 8;
    }
    pNVar2 = (NaReal *)operator_new__(uVar5);
    this->fCurVal = pNVar2;
    if (-1 < iVar) {
      uVar5 = 0;
      do {
        NVar6 = fVal;
        if ((uint)iVar != uVar5) {
          NVar6 = 0.0;
        }
        pNVar2[uVar5] = NVar6;
        uVar5 = uVar5 + 1;
      } while (iVar + 1U != uVar5);
    }
  }
  else {
    pNVar2 = this->fCurVal;
    if (iVar < iVar1) {
      pNVar2[iVar] = fVal;
    }
    else {
      this->nVar = iVar + 1U;
      uVar5 = 0xffffffffffffffff;
      if (-2 < iVar) {
        uVar5 = (long)iVar * 8 + 8;
      }
      pNVar3 = (NaReal *)operator_new__(uVar5);
      this->fCurVal = pNVar3;
      if (-1 < iVar) {
        uVar5 = 0;
        do {
          if ((long)uVar5 < (long)iVar1) {
            pNVar3[uVar5] = pNVar2[uVar5];
          }
          else if ((uint)iVar == uVar5) {
            pNVar3[uVar5] = fVal;
          }
          else {
            pNVar3[uVar5] = 0.0;
          }
          uVar5 = uVar5 + 1;
        } while (iVar + 1U != uVar5);
      }
      if (pNVar2 != (NaReal *)0x0) {
        operator_delete__(pNVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void    NaTextStreamFile::SetValue (NaReal fVal, int iVar)
{
    if(-1 == iCase)
        throw(na_out_of_range);

    if(0 == nVar){
        // Number of values in record is not defined yet
        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
    }else if(iVar < nVar){
        // Setting variable among known ones
        fCurVal[iVar] = fVal;
    }else if(iVar >= nVar){
        // Setting variable beyond known ones
        NaReal      *pOld = fCurVal;
        int    nOld = nVar;

        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i < nOld){
                fCurVal[i] = pOld[i];
            }else if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
        delete[] pOld;
    }
}